

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

EventSet * KokkosTools::ChromeTracing::get_event_set(void)

{
  EventSet *in_RDI;
  
  memset(&in_RDI->parse_args,0,0x888);
  in_RDI->init = kokkosp_init_library;
  in_RDI->finalize = kokkosp_finalize_library;
  in_RDI->push_region = kokkosp_push_profile_region;
  in_RDI->pop_region = kokkosp_pop_profile_region;
  in_RDI->begin_parallel_for = kokkosp_begin_parallel_for;
  in_RDI->begin_parallel_reduce = kokkosp_begin_parallel_reduce;
  in_RDI->begin_parallel_scan = kokkosp_begin_parallel_scan;
  in_RDI->end_parallel_for = kokkosp_end_parallel_for;
  in_RDI->end_parallel_reduce = kokkosp_end_parallel_reduce;
  in_RDI->end_parallel_scan = kokkosp_end_parallel_scan;
  in_RDI->begin_deep_copy = kokkosp_begin_deep_copy;
  in_RDI->end_deep_copy = kokkosp_end_deep_copy;
  return in_RDI;
}

Assistant:

Kokkos::Tools::Experimental::EventSet get_event_set() {
  Kokkos::Tools::Experimental::EventSet my_event_set;
  memset(&my_event_set, 0,
         sizeof(my_event_set));  // zero any pointers not set here
  my_event_set.init                  = kokkosp_init_library;
  my_event_set.finalize              = kokkosp_finalize_library;
  my_event_set.push_region           = kokkosp_push_profile_region;
  my_event_set.pop_region            = kokkosp_pop_profile_region;
  my_event_set.begin_parallel_for    = kokkosp_begin_parallel_for;
  my_event_set.begin_parallel_reduce = kokkosp_begin_parallel_reduce;
  my_event_set.begin_parallel_scan   = kokkosp_begin_parallel_scan;
  my_event_set.end_parallel_for      = kokkosp_end_parallel_for;
  my_event_set.end_parallel_reduce   = kokkosp_end_parallel_reduce;
  my_event_set.end_parallel_scan     = kokkosp_end_parallel_scan;
  my_event_set.begin_deep_copy       = kokkosp_begin_deep_copy;
  my_event_set.end_deep_copy         = kokkosp_end_deep_copy;
  return my_event_set;
}